

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O2

ssize_t archive_write_zip_data(archive_write *a,void *buff,size_t s)

{
  uint8_t *puVar1;
  long lVar2;
  size_t nbytes;
  uint8_t uVar3;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  undefined4 uVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  uint8_t *rb;
  uint8_t *in;
  size_t sVar11;
  size_t key_len;
  ulong uVar12;
  uint8_t salt [18];
  uint8_t key [12];
  uint8_t auStack_68 [56];
  
  pvVar4 = a->format_data;
  if ((long)*(ulong *)((long)pvVar4 + 0x28) < (long)s) {
    s = *(ulong *)((long)pvVar4 + 0x28);
  }
  *(long *)((long)pvVar4 + 0x20) = *(long *)((long)pvVar4 + 0x20) + s;
  if (s == 0) {
    return 0;
  }
  if ((*(byte *)((long)pvVar4 + 0x44) & 1) == 0) {
LAB_00174abf:
    if (*(int *)((long)pvVar4 + 0x3c) == 8) {
      *(void **)((long)pvVar4 + 0x140) = buff;
      *(int *)((long)pvVar4 + 0x148) = (int)s;
      do {
        iVar8 = cm_zlib_deflate((z_streamp)((long)pvVar4 + 0x140),0);
        if (iVar8 == -2) {
          return -0x1e;
        }
        if (*(int *)((long)pvVar4 + 0x160) == 0) {
          if (*(char *)((long)pvVar4 + 0x5c) == '\0') {
            if (*(char *)((long)pvVar4 + 0xc0) != '\0') {
              key._0_8_ = *(size_t *)((long)pvVar4 + 0x1b0);
              iVar8 = aes_ctr_update((archive_crypto_ctx *)((long)pvVar4 + 0x68),
                                     *(uint8_t **)((long)pvVar4 + 0x1b8),key._0_8_,
                                     *(uint8_t **)((long)pvVar4 + 0x1b8),(size_t *)key);
              if (iVar8 < 0) goto LAB_00174d5d;
              __hmac_sha1_update((archive_hmac_sha1_ctx *)((long)pvVar4 + 200),
                                 *(uint8_t **)((long)pvVar4 + 0x1b8),
                                 *(size_t *)((long)pvVar4 + 0x1b0));
            }
          }
          else {
            trad_enc_encrypt_update
                      ((trad_enc_ctx *)((long)pvVar4 + 0x50),*(uint8_t **)((long)pvVar4 + 0x1b8),
                       *(size_t *)((long)pvVar4 + 0x1b0),*(uint8_t **)((long)pvVar4 + 0x1b8),
                       *(size_t *)((long)pvVar4 + 0x1b0));
          }
          iVar8 = __archive_write_output
                            (a,*(void **)((long)pvVar4 + 0x1b8),*(size_t *)((long)pvVar4 + 0x1b0));
          if (iVar8 != 0) goto LAB_00174dc5;
          lVar2 = *(long *)((long)pvVar4 + 0x1b0);
          *(long *)((long)pvVar4 + 0x18) = *(long *)((long)pvVar4 + 0x18) + lVar2;
          *(long *)((long)pvVar4 + 0x110) = *(long *)((long)pvVar4 + 0x110) + lVar2;
          *(undefined8 *)((long)pvVar4 + 0x158) = *(undefined8 *)((long)pvVar4 + 0x1b8);
          *(int *)((long)pvVar4 + 0x160) = (int)lVar2;
        }
      } while (*(int *)((long)pvVar4 + 0x148) != 0);
    }
    else {
      if (*(int *)((long)pvVar4 + 0x3c) != 0) {
        archive_set_error(&a->archive,-1,"Invalid ZIP compression type");
        return -0x1e;
      }
      if ((*(char *)((long)pvVar4 + 0x5c) == '\0') && (*(char *)((long)pvVar4 + 0xc0) == '\0')) {
        iVar8 = __archive_write_output(a,buff,s);
        if (iVar8 != 0) goto LAB_00174dc5;
        *(long *)((long)pvVar4 + 0x110) = *(long *)((long)pvVar4 + 0x110) + s;
        *(long *)((long)pvVar4 + 0x18) = *(long *)((long)pvVar4 + 0x18) + s;
      }
      else {
        puVar1 = (uint8_t *)(s + (long)buff);
        for (in = (uint8_t *)buff; in < puVar1; in = in + key._0_8_) {
          if (*(char *)((long)pvVar4 + 0x5c) == '\0') {
            key._0_8_ = *(undefined8 *)((long)pvVar4 + 0x1b0);
            iVar8 = aes_ctr_update((archive_crypto_ctx *)((long)pvVar4 + 0x68),in,
                                   (long)puVar1 - (long)in,*(uint8_t **)((long)pvVar4 + 0x1b8),
                                   (size_t *)key);
            if (iVar8 < 0) {
LAB_00174d5d:
              archive_set_error(&a->archive,-1,"Failed to encrypt file");
              return -0x19;
            }
            __hmac_sha1_update((archive_hmac_sha1_ctx *)((long)pvVar4 + 200),
                               *(uint8_t **)((long)pvVar4 + 0x1b8),key._0_8_);
          }
          else {
            uVar6 = trad_enc_encrypt_update
                              ((trad_enc_ctx *)((long)pvVar4 + 0x50),in,(long)puVar1 - (long)in,
                               *(uint8_t **)((long)pvVar4 + 0x1b8),*(size_t *)((long)pvVar4 + 0x1b0)
                              );
            key._0_8_ = ZEXT48(uVar6);
          }
          iVar8 = __archive_write_output(a,*(void **)((long)pvVar4 + 0x1b8),key._0_8_);
          if (iVar8 != 0) goto LAB_00174dc5;
          *(long *)((long)pvVar4 + 0x18) = *(long *)((long)pvVar4 + 0x18) + key._0_8_;
          *(long *)((long)pvVar4 + 0x110) = *(long *)((long)pvVar4 + 0x110) + key._0_8_;
        }
      }
    }
    *(long *)((long)pvVar4 + 0x28) = *(long *)((long)pvVar4 + 0x28) - s;
    if ((*(char *)((long)pvVar4 + 0xc0) == '\0') || (*(int *)((long)pvVar4 + 0x60) != 2)) {
      uVar7 = (**(code **)((long)pvVar4 + 0xe8))
                        (*(undefined4 *)((long)pvVar4 + 0x38),buff,s & 0xffffffff);
      *(undefined4 *)((long)pvVar4 + 0x38) = uVar7;
    }
  }
  else {
    if (1 < *(int *)((long)pvVar4 + 0x40) - 2U) {
      if ((*(int *)((long)pvVar4 + 0x40) == 1) && (*(char *)((long)pvVar4 + 0x5c) == '\0')) {
        pcVar9 = __archive_write_get_passphrase(a);
        if (pcVar9 == (char *)0x0) goto LAB_00174dae;
        iVar8 = archive_random(key,0xb);
        if (iVar8 != 0) goto LAB_00174d96;
        sVar10 = strlen(pcVar9);
        *(undefined8 *)((long)pvVar4 + 0x50) = 0x2345678912345678;
        *(undefined4 *)((long)pvVar4 + 0x58) = 0x34567890;
        for (sVar11 = 0; sVar10 != sVar11; sVar11 = sVar11 + 1) {
          trad_enc_update_keys((trad_enc_ctx *)((long)pvVar4 + 0x50),pcVar9[sVar11]);
        }
        key[0xb] = *(uint8_t *)((long)pvVar4 + 0x5d);
        trad_enc_encrypt_update((trad_enc_ctx *)((long)pvVar4 + 0x50),key,0xc,salt,0xc);
        iVar8 = __archive_write_output(a,salt,0xc);
        if (iVar8 != 0) goto LAB_00174dc5;
        *(long *)((long)pvVar4 + 0x110) = *(long *)((long)pvVar4 + 0x110) + 0xc;
        *(long *)((long)pvVar4 + 0x18) = *(long *)((long)pvVar4 + 0x18) + 0xc;
        *(undefined1 *)((long)pvVar4 + 0x5c) = 1;
      }
      goto LAB_00174abf;
    }
    if (*(char *)((long)pvVar4 + 0xc0) != '\0') goto LAB_00174abf;
    pcVar9 = __archive_write_get_passphrase(a);
    if (pcVar9 == (char *)0x0) {
LAB_00174dae:
      pcVar9 = "Encryption needs passphrase";
LAB_00174db5:
      archive_set_error(&a->archive,-1,pcVar9);
      iVar8 = -0x19;
    }
    else {
      iVar8 = *(int *)((long)pvVar4 + 0x40);
      lVar2 = (ulong)(iVar8 != 2) * 8;
      nbytes = lVar2 + 8;
      iVar5 = archive_random(salt,nbytes);
      if (iVar5 == 0) {
        key_len = (ulong)(iVar8 != 2) * 0x10 + 0x10;
        sVar10 = strlen(pcVar9);
        uVar12 = (ulong)(uint)((int)key_len * 2);
        pbkdf2_sha1(pcVar9,sVar10,salt,nbytes,1000,key,uVar12 | 2);
        iVar5 = aes_ctr_init((archive_crypto_ctx *)((long)pvVar4 + 0x68),key,key_len);
        if (iVar5 == 0) {
          iVar5 = __hmac_sha1_init((archive_hmac_sha1_ctx *)((long)pvVar4 + 200),
                                   auStack_68 + (ulong)(iVar8 != 2) * 0x10,key_len);
          if (iVar5 == 0) {
            uVar3 = key[uVar12 + 1];
            salt[(ulong)(iVar8 != 2) * 8 + 8] = key[uVar12];
            salt[lVar2 + 9] = uVar3;
            uVar12 = nbytes | 2;
            iVar8 = __archive_write_output(a,salt,uVar12);
            if (iVar8 != 0) goto LAB_00174dc5;
            *(long *)((long)pvVar4 + 0x110) = *(long *)((long)pvVar4 + 0x110) + uVar12;
            *(long *)((long)pvVar4 + 0x18) = *(long *)((long)pvVar4 + 0x18) + uVar12;
            *(undefined1 *)((long)pvVar4 + 0xd0) = 1;
            *(undefined1 *)((long)pvVar4 + 0xc0) = 1;
            goto LAB_00174abf;
          }
          aes_ctr_release((archive_crypto_ctx *)((long)pvVar4 + 0x68));
          pcVar9 = "Failed to initialize HMAC-SHA1";
        }
        else {
          pcVar9 = "Decryption is unsupported due to lack of crypto library";
        }
        goto LAB_00174db5;
      }
LAB_00174d96:
      archive_set_error(&a->archive,-1,"Can\'t generate random number for encryption");
      iVar8 = -0x1e;
    }
LAB_00174dc5:
    s = (size_t)iVar8;
  }
  return s;
}

Assistant:

static ssize_t
archive_write_zip_data(struct archive_write *a, const void *buff, size_t s)
{
	int ret;
	struct zip *zip = a->format_data;

	if ((int64_t)s > zip->entry_uncompressed_limit)
		s = (size_t)zip->entry_uncompressed_limit;
	zip->entry_uncompressed_written += s;

	if (s == 0) return 0;

	if (zip->entry_flags & ZIP_ENTRY_FLAG_ENCRYPTED) {
		switch (zip->entry_encryption) {
		case ENCRYPTION_TRADITIONAL:
			/* Initialize traditional PKWARE encryption context. */
			if (!zip->tctx_valid) {
				ret = init_traditional_pkware_encryption(a);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->tctx_valid = 1;
			}
			break;
		case ENCRYPTION_WINZIP_AES128:
		case ENCRYPTION_WINZIP_AES256:
			if (!zip->cctx_valid) {
				ret = init_winzip_aes_encryption(a);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->cctx_valid = zip->hctx_valid = 1;
			}
			break;
		case ENCRYPTION_NONE:
		default:
			break;
		}
	}

	switch (zip->entry_compression) {
	case COMPRESSION_STORE:
		if (zip->tctx_valid || zip->cctx_valid) {
			const uint8_t *rb = (const uint8_t *)buff;
			const uint8_t * const re = rb + s;

			while (rb < re) {
				size_t l;

				if (zip->tctx_valid) {
					l = trad_enc_encrypt_update(&zip->tctx,
					    rb, re - rb,
					    zip->buf, zip->len_buf);
				} else {
					l = zip->len_buf;
					ret = archive_encrypto_aes_ctr_update(
					    &zip->cctx,
					    rb, re - rb, zip->buf, &l);
					if (ret < 0) {
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_MISC,
						    "Failed to encrypt file");
						return (ARCHIVE_FAILED);
					}
					archive_hmac_sha1_update(&zip->hctx,
					    zip->buf, l);
				}
				ret = __archive_write_output(a, zip->buf, l);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += l;
				zip->written_bytes += l;
				rb += l;
			}
		} else {
			ret = __archive_write_output(a, buff, s);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->written_bytes += s;
			zip->entry_compressed_written += s;
		}
		break;
#if HAVE_ZLIB_H
	case COMPRESSION_DEFLATE:
		zip->stream.next_in = (unsigned char*)(uintptr_t)buff;
		zip->stream.avail_in = (uInt)s;
		do {
			ret = deflate(&zip->stream, Z_NO_FLUSH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			if (zip->stream.avail_out == 0) {
				if (zip->tctx_valid) {
					trad_enc_encrypt_update(&zip->tctx,
					    zip->buf, zip->len_buf,
					    zip->buf, zip->len_buf);
				} else if (zip->cctx_valid) {
					size_t outl = zip->len_buf;
					ret = archive_encrypto_aes_ctr_update(
					    &zip->cctx,
					    zip->buf, zip->len_buf,
					    zip->buf, &outl);
					if (ret < 0) {
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_MISC,
						    "Failed to encrypt file");
						return (ARCHIVE_FAILED);
					}
					archive_hmac_sha1_update(&zip->hctx,
					    zip->buf, zip->len_buf);
				}
				ret = __archive_write_output(a, zip->buf,
					zip->len_buf);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += zip->len_buf;
				zip->written_bytes += zip->len_buf;
				zip->stream.next_out = zip->buf;
				zip->stream.avail_out = (uInt)zip->len_buf;
			}
		} while (zip->stream.avail_in != 0);
		break;
#endif

	case COMPRESSION_UNSPECIFIED:
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid ZIP compression type");
		return ARCHIVE_FATAL;
	}

	zip->entry_uncompressed_limit -= s;
	if (!zip->cctx_valid || zip->aes_vendor != AES_VENDOR_AE_2)
		zip->entry_crc32 =
		    zip->crc32func(zip->entry_crc32, buff, (unsigned)s);
	return (s);

}